

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSizePromotion.cpp
# Opt level: O2

void __thiscall
gl3cts::TextureSizePromotion::FunctionalTest::cleanVertexArrayObject(FunctionalTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (this->m_vao != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x490))(1,&this->m_vao);
    this->m_vao = 0;
  }
  return;
}

Assistant:

void FunctionalTest::cleanVertexArrayObject()
{
	/* GL functions object. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Delete object. */
	if (m_vao)
	{
		gl.deleteVertexArrays(1, &m_vao);

		m_vao = 0;
	}
}